

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugOperationWithDeref(DebugInfoManager *this)

{
  IRContext *pIVar1;
  uint32_t res_id;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  Instruction *pIVar4;
  TypeManager *pTVar5;
  ConstantManager *this_00;
  DefUseManager *this_01;
  long lVar6;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_168;
  uint32_t local_160;
  uint local_15c [2];
  uint32_t local_154;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pIVar4 = this->deref_operation_;
  if (pIVar4 == (Instruction *)0x0) {
    res_id = IRContext::TakeNextId(this->context_);
    pFVar3 = IRContext::get_feature_mgr(this->context_);
    if (pFVar3->extinst_importid_OpenCL100DebugInfo_ == 0) {
      this_00 = IRContext::get_constant_mgr(this->context_);
      local_160 = ConstantManager::GetUIntConstId(this_00,0);
      pIVar4 = (Instruction *)::operator_new(0x70);
      pIVar1 = this->context_;
      pTVar5 = IRContext::get_type_mgr(pIVar1);
      uVar2 = TypeManager::GetVoidTypeId(pTVar5);
      local_154 = GetDbgSetImportId(this);
      init_list_02._M_len = 1;
      init_list_02._M_array = &local_154;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list_02);
      local_c0._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
      local_15c[1] = 0x1e;
      init_list_03._M_len = 1;
      init_list_03._M_array = local_15c + 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_03);
      local_90 = 7;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
      local_15c[0] = local_160;
      init_list_04._M_len = 1;
      init_list_04._M_array = local_15c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_04);
      local_60 = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
                 local_c0,&stack0xffffffffffffffd0);
      Instruction::Instruction(pIVar4,pIVar1,OpExtInst,uVar2,res_id,(OperandList *)&local_d8);
      local_168._M_head_impl = pIVar4;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_d8);
      lVar6 = 0x68;
      do {
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar6));
        lVar6 = lVar6 + -0x30;
      } while (lVar6 != -0x28);
    }
    else {
      pIVar4 = (Instruction *)::operator_new(0x70);
      pIVar1 = this->context_;
      pTVar5 = IRContext::get_type_mgr(pIVar1);
      uVar2 = TypeManager::GetVoidTypeId(pTVar5);
      local_154 = GetDbgSetImportId(this);
      init_list._M_len = 1;
      init_list._M_array = &local_154;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
      local_c0._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
      local_15c[1] = 0x1e;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_15c + 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
      local_90 = 7;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
      local_15c[0] = 0;
      init_list_01._M_len = 1;
      init_list_01._M_array = local_15c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
      local_60 = 0x41;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
                 local_c0,&stack0xffffffffffffffd0);
      Instruction::Instruction(pIVar4,pIVar1,OpExtInst,uVar2,res_id,(OperandList *)&local_d8);
      local_168._M_head_impl = pIVar4;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_d8);
      lVar6 = 0x68;
      do {
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar6));
        lVar6 = lVar6 + -0x30;
      } while (lVar6 != -0x28);
    }
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
    pIVar4 = Instruction::InsertBefore
                       ((((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                        sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
                        (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_168);
    this->deref_operation_ = pIVar4;
    RegisterDbgInst(this,pIVar4);
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      this_01 = IRContext::get_def_use_mgr(this->context_);
      DefUseManager::AnalyzeInstDefUse(this_01,this->deref_operation_);
    }
    pIVar4 = this->deref_operation_;
    if (local_168._M_head_impl != (Instruction *)0x0) {
      (*((local_168._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return pIVar4;
}

Assistant:

Instruction* DebugInfoManager::GetDebugOperationWithDeref() {
  if (deref_operation_ != nullptr) return deref_operation_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> deref_operation;

  if (context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    deref_operation = std::unique_ptr<Instruction>(new Instruction(
        context(), spv::Op::OpExtInst,
        context()->get_type_mgr()->GetVoidTypeId(), result_id,
        {
            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
             {static_cast<uint32_t>(OpenCLDebugInfo100DebugOperation)}},
            {SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION,
             {static_cast<uint32_t>(OpenCLDebugInfo100Deref)}},
        }));
  } else {
    uint32_t deref_id = context()->get_constant_mgr()->GetUIntConstId(
        NonSemanticShaderDebugInfo100Deref);

    deref_operation = std::unique_ptr<Instruction>(
        new Instruction(context(), spv::Op::OpExtInst,
                        context()->get_type_mgr()->GetVoidTypeId(), result_id,
                        {
                            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
                            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                             {static_cast<uint32_t>(
                                 NonSemanticShaderDebugInfo100DebugOperation)}},
                            {SPV_OPERAND_TYPE_ID, {deref_id}},
                        }));
  }

  // Add to the front of |ext_inst_debuginfo_|.
  deref_operation_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(deref_operation));

  RegisterDbgInst(deref_operation_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_operation_);
  return deref_operation_;
}